

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::StructPackArgs
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  char *nameprefix_00;
  string local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  FieldDef *local_48;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_38;
  const_iterator it;
  string *code;
  string *code_ptr_local;
  char *nameprefix_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_38._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppFVar2;
    if ((local_48->value).type.base_type == BASE_TYPE_STRUCT) {
      struct_def_00 = (local_48->value).type.struct_def;
      IdlNamer::Field_abi_cxx11_(&local_a8,&this->namer_,local_48);
      std::operator+(&local_88,nameprefix,&local_a8);
      std::operator+(&local_68,&local_88,".");
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      StructPackArgs(this,struct_def_00,nameprefix_00,code_ptr);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,", t.",&local_119);
      std::operator+(&local_f8,&local_118,nameprefix);
      IdlNamer::Field_abi_cxx11_(&local_140,&this->namer_,local_48);
      std::operator+(&local_d8,&local_f8,&local_140);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void StructPackArgs(const StructDef &struct_def, const char *nameprefix,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        StructPackArgs(*field.value.type.struct_def,
                       (nameprefix + namer_.Field(field) + ".").c_str(),
                       code_ptr);
      } else {
        code += std::string(", t.") + nameprefix + namer_.Field(field);
      }
    }
  }